

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_add(ASMState *as,IRIns *ir)

{
  int iVar1;
  long in_RSI;
  long in_RDI;
  x86Op unaff_retaddr;
  IRIns *in_stack_00000018;
  ASMState *in_stack_00000020;
  
  if ((*(byte *)(in_RSI + 4) & 0x1f) == 0xe) {
    asm_fparith(as,ir,unaff_retaddr);
  }
  else if (((((*(uint *)(in_RDI + 0xb8) & 0x800) != 0) ||
            (*(long *)(in_RDI + 0x128) == *(long *)(in_RDI + 0x80))) ||
           ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0)) ||
          (iVar1 = asm_lea((ASMState *)&in_stack_00000018->field_0,(IRIns *)as), iVar1 == 0)) {
    asm_intarith(in_stack_00000020,in_stack_00000018,as._4_4_);
  }
  return;
}

Assistant:

static void asm_add(ASMState *as, IRIns *ir)
{
  if (irt_isnum(ir->t))
    asm_fparith(as, ir, XO_ADDSD);
  else if ((as->flags & JIT_F_LEA_AGU) || as->flagmcp == as->mcp ||
	   irt_is64(ir->t) || !asm_lea(as, ir))
    asm_intarith(as, ir, XOg_ADD);
}